

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O0

void load(int r,SValue *sv)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int local_88;
  int local_84;
  int align;
  int ll;
  int b;
  int tr;
  SValue v1;
  uint local_2c;
  uint local_28;
  int fr;
  int fc;
  int ft;
  int t;
  int v;
  SValue *sv_local;
  int r_local;
  
  uVar1 = sv->r;
  local_2c = (uint)uVar1;
  uVar2 = (sv->type).t;
  uVar3 = (sv->c).i;
  local_28 = (uint)uVar3;
  if (((long)(int)local_28 != (sv->c).i) && ((uVar1 & 0x200) != 0)) {
    tcc_error("64 bit addend in load");
  }
  fr = uVar2 & 0xfffffcdf;
  if (((((local_2c & 0x3f) == 0x30) && ((uVar1 & 0x200) != 0)) && ((uVar1 & 0x100) != 0)) &&
     (((sv->sym->type).t & 0x2000U) == 0)) {
    ll = r | 0x20;
    iVar4 = is_float(fr);
    if (iVar4 != 0) {
      uVar5 = get_reg(1);
      ll = uVar5 | 0x20;
    }
    gen_modrm64(0x8b,ll,local_2c,sv->sym,0);
    local_2c = ll | 0x100;
  }
  uVar5 = local_2c & 0x3f;
  if ((local_2c & 0x100) == 0) {
    if (uVar5 == 0x30) {
      if ((local_2c & 0x200) == 0) {
        iVar4 = is64_type(fr);
        if (iVar4 == 0) {
          orex(0,r,0,(r & 7U) + 0xb8);
          gen_le32(local_28);
        }
        else {
          orex(1,r,0,(r & 7U) + 0xb8);
          gen_le64((sv->c).i);
        }
      }
      else if (((sv->sym->type).t & 0x2000U) == 0) {
        orex(1,0,r,0x8b);
        o((r & 7U) * 8 + 5);
        gen_gotpcrel(r,sv->sym,local_28);
      }
      else {
        orex(1,0,r,0x8d);
        o((r & 7U) * 8 + 5);
        gen_addrpc32(local_2c,sv->sym,local_28);
      }
    }
    else if (uVar5 == 0x32) {
      orex(1,0,r,0x8d);
      gen_modrm(r,0x32,sv->sym,local_28);
    }
    else if (uVar5 == 0x33) {
      orex(0,r,0,0);
      if ((local_28 & 0xfffffeff) == 0x95) {
        oad((r & 7U) + 0xb8,1);
      }
      else {
        oad((r & 7U) + 0xb8,0);
      }
      if ((uVar3 & 0x100) != 0) {
        local_28 = local_28 & 0xfffffeff;
        o((r >> 3 & 1U) * 0x100 + 0x37a);
      }
      orex(0,r,0,0xf);
      o(local_28);
      o((r & 7U) + 0xc0);
    }
    else if ((uVar5 == 0x34) || (uVar5 == 0x35)) {
      orex(0,r,0,0);
      oad((r & 7U) + 0xb8,local_2c & 1);
      o((r >> 3 & 1U) * 0x100 + 0x5eb);
      gsym(local_28);
      orex(0,r,0,0);
      oad((r & 7U) + 0xb8,local_2c & 1 ^ 1);
    }
    else if (uVar5 != r) {
      if ((r < 0x10) || (0x17 < r)) {
        if (r == 0x18) {
          if ((uVar5 < 0x10) || (0x17 < uVar5)) {
            __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                          ,0x1f9,"void load(int, SValue *)");
          }
          o(0x110ff2);
          o(0x44);
          o(0xf024);
          o(0xf02444dd);
        }
        else {
          orex(1,r,uVar5,0x89);
          o((r & 7U) + 0xc0 + (local_2c & 7) * 8);
        }
      }
      else if (uVar5 == 0x18) {
        o(0xf0245cdd);
        o(0x100ff2);
        o((r & 7U) * 8 + 0x44);
        o(0xf024);
      }
      else {
        if ((uVar5 < 0x10) || (0x17 < uVar5)) {
          __assert_fail("(v >= TREG_XMM0) && (v <= TREG_XMM7)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                        ,0x1ef,"void load(int, SValue *)");
        }
        if ((uVar2 & 0xf) == 8) {
          o(0x100ff3);
        }
        else {
          if ((uVar2 & 0xf) != 9) {
            __assert_fail("(ft & VT_BTYPE) == VT_DOUBLE",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                          ,499,"void load(int, SValue *)");
          }
          o(0x100ff2);
        }
        o((local_2c & 7) + 0xc0 + (r & 7U) * 8);
      }
    }
  }
  else {
    if (uVar5 == 0x31) {
      b = 5;
      v1.type.ref._0_2_ = 0x132;
      v1._24_8_ = SEXT48((int)local_28);
      local_2c = r;
      if ((reg_classes[r] & 0x801U) == 0) {
        local_2c = get_reg(1);
      }
      load(local_2c,(SValue *)&b);
    }
    if ((long)(int)local_28 != (sv->c).i) {
      b = 4;
      v1.type.ref._0_2_ = 0x30;
      v1._24_8_ = *(undefined8 *)&sv->c;
      local_2c = r;
      if ((reg_classes[r] & 0x801U) == 0) {
        local_2c = get_reg(1);
      }
      load(local_2c,(SValue *)&b);
      local_28 = 0;
    }
    local_84 = 0;
    if ((uVar2 & 0xf) == 7) {
      iVar4 = type_size(&sv->type,&local_88);
      switch(iVar4) {
      case 1:
        fr = 1;
        break;
      case 2:
        fr = 2;
        break;
      default:
        tcc_error("invalid aggregate type for register load");
      case 4:
        fr = 3;
        break;
      case 8:
        fr = 4;
      }
    }
    if ((fr & 0xfU) == 8) {
      align = 0x6e0f66;
      sv_local._4_4_ = r & 7;
    }
    else if ((fr & 0xfU) == 9) {
      align = 0x7e0ff3;
      sv_local._4_4_ = r & 7;
    }
    else if ((fr & 0xfU) == 10) {
      align = 0xdb;
      sv_local._4_4_ = 5;
    }
    else {
      sv_local._4_4_ = r;
      if (((fr & 0xf0f7fU) == 1) || ((fr & 0xf0f7fU) == 0xb)) {
        align = 0xbe0f;
      }
      else if ((fr & 0xf0f7fU) == 0x11) {
        align = 0xb60f;
      }
      else if ((fr & 0xf0f7fU) == 2) {
        align = 0xbf0f;
      }
      else if ((fr & 0xf0f7fU) == 0x12) {
        align = 0xb70f;
      }
      else {
        if (((((fr & 0xfU) != 3) && ((fr & 0xfU) != 4)) && ((fr & 0xfU) != 5)) && ((fr & 0xfU) != 6)
           ) {
          __assert_fail("((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) || ((ft & VT_BTYPE) == VT_FUNC)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/zhyingkun[P]TinyCC/libtcc/src/x86_64-gen.c"
                        ,0x1a7,"void load(int, SValue *)");
        }
        local_84 = is64_type(fr);
        align = 0x8b;
      }
    }
    if (local_84 == 0) {
      orex(0,local_2c,sv_local._4_4_,align);
      gen_modrm(sv_local._4_4_,local_2c,sv->sym,local_28);
    }
    else {
      gen_modrm64(align,sv_local._4_4_,local_2c,sv->sym,local_28);
    }
  }
  return;
}

Assistant:

void load(int r, SValue* sv) {
  int v, t, ft, fc, fr;
  SValue v1;

#ifdef TCC_TARGET_PE
  SValue v2;
  sv = pe_getimport(sv, &v2);
#endif

  fr = sv->r;
  ft = sv->type.t & ~VT_DEFSIGN;
  fc = sv->c.i;
  if (fc != sv->c.i && (fr & VT_SYM))
    tcc_error("64 bit addend in load");

  ft &= ~(VT_VOLATILE | VT_CONSTANT);

#ifndef TCC_TARGET_PE
  /* we use indirect access via got */
  if ((fr & VT_VALMASK) == VT_CONST && (fr & VT_SYM) && (fr & VT_LVAL) && !(sv->sym->type.t & VT_STATIC)) {
    /* use the result register as a temporal register */
    int tr = r | TREG_MEM;
    if (is_float(ft)) {
      /* we cannot use float registers as a temporal register */
      tr = get_reg(RC_INT) | TREG_MEM;
    }
    gen_modrm64(0x8b, tr, fr, sv->sym, 0);

    /* load from the temporal register */
    fr = tr | VT_LVAL;
  }
#endif

  v = fr & VT_VALMASK;
  if (fr & VT_LVAL) {
    int b, ll;
    if (v == VT_LLOCAL) {
      v1.type.t = VT_PTR;
      v1.r = VT_LOCAL | VT_LVAL;
      v1.c.i = fc;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
    }
    if (fc != sv->c.i) {
      /* If the addends doesn't fit into a 32bit signed
         we must use a 64bit move.  We've checked above
         that this doesn't have a sym associated.  */
      v1.type.t = VT_LLONG;
      v1.r = VT_CONST;
      v1.c.i = sv->c.i;
      fr = r;
      if (!(reg_classes[fr] & (RC_INT | RC_R11)))
        fr = get_reg(RC_INT);
      load(fr, &v1);
      fc = 0;
    }
    ll = 0;
    /* Like GCC we can load from small enough properly sized
       structs and unions as well.
       XXX maybe move to generic operand handling, but should
       occur only with asm, so tccasm.c might also be a better place */
    if ((ft & VT_BTYPE) == VT_STRUCT) {
      int align;
      switch (type_size(&sv->type, &align)) {
        case 1:
          ft = VT_BYTE;
          break;
        case 2:
          ft = VT_SHORT;
          break;
        case 4:
          ft = VT_INT;
          break;
        case 8:
          ft = VT_LLONG;
          break;
        default:
          tcc_error("invalid aggregate type for register load");
          break;
      }
    }
    if ((ft & VT_BTYPE) == VT_FLOAT) {
      b = 0x6e0f66;
      r = REG_VALUE(r); /* movd */
    } else if ((ft & VT_BTYPE) == VT_DOUBLE) {
      b = 0x7e0ff3; /* movq */
      r = REG_VALUE(r);
    } else if ((ft & VT_BTYPE) == VT_LDOUBLE) {
      b = 0xdb, r = 5; /* fldt */
    } else if ((ft & VT_TYPE) == VT_BYTE || (ft & VT_TYPE) == VT_BOOL) {
      b = 0xbe0f; /* movsbl */
    } else if ((ft & VT_TYPE) == (VT_BYTE | VT_UNSIGNED)) {
      b = 0xb60f; /* movzbl */
    } else if ((ft & VT_TYPE) == VT_SHORT) {
      b = 0xbf0f; /* movswl */
    } else if ((ft & VT_TYPE) == (VT_SHORT | VT_UNSIGNED)) {
      b = 0xb70f; /* movzwl */
    } else {
      assert(((ft & VT_BTYPE) == VT_INT) || ((ft & VT_BTYPE) == VT_LLONG) || ((ft & VT_BTYPE) == VT_PTR) ||
             ((ft & VT_BTYPE) == VT_FUNC));
      ll = is64_type(ft);
      b = 0x8b;
    }
    if (ll) {
      gen_modrm64(b, r, fr, sv->sym, fc);
    } else {
      orex(ll, fr, r, b);
      gen_modrm(r, fr, sv->sym, fc);
    }
  } else {
    if (v == VT_CONST) {
      if (fr & VT_SYM) {
#ifdef TCC_TARGET_PE
        orex(1, 0, r, 0x8d);
        o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
        gen_addrpc32(fr, sv->sym, fc);
#else
        if (sv->sym->type.t & VT_STATIC) {
          orex(1, 0, r, 0x8d);
          o(0x05 + REG_VALUE(r) * 8); /* lea xx(%rip), r */
          gen_addrpc32(fr, sv->sym, fc);
        } else {
          orex(1, 0, r, 0x8b);
          o(0x05 + REG_VALUE(r) * 8); /* mov xx(%rip), r */
          gen_gotpcrel(r, sv->sym, fc);
        }
#endif
      } else if (is64_type(ft)) {
        orex(1, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le64(sv->c.i);
      } else {
        orex(0, r, 0, 0xb8 + REG_VALUE(r)); /* mov $xx, r */
        gen_le32(fc);
      }
    } else if (v == VT_LOCAL) {
      orex(1, 0, r, 0x8d); /* lea xxx(%ebp), r */
      gen_modrm(r, VT_LOCAL, sv->sym, fc);
    } else if (v == VT_CMP) {
      orex(0, r, 0, 0);
      if ((fc & ~0x100) != TOK_NE)
        oad(0xb8 + REG_VALUE(r), 0); /* mov $0, r */
      else
        oad(0xb8 + REG_VALUE(r), 1); /* mov $1, r */
      if (fc & 0x100) {
        /* This was a float compare.  If the parity bit is
       set the result was unordered, meaning false for everything
       except TOK_NE, and true for TOK_NE.  */
        fc &= ~0x100;
        o(0x037a + (REX_BASE(r) << 8));
      }
      orex(0, r, 0, 0x0f); /* setxx %br */
      o(fc);
      o(0xc0 + REG_VALUE(r));
    } else if (v == VT_JMP || v == VT_JMPI) {
      t = v & 1;
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t); /* mov $1, r */
      o(0x05eb + (REX_BASE(r) << 8)); /* jmp after */
      gsym(fc);
      orex(0, r, 0, 0);
      oad(0xb8 + REG_VALUE(r), t ^ 1); /* mov $0, r */
    } else if (v != r) {
      if ((r >= TREG_XMM0) && (r <= TREG_XMM7)) {
        if (v == TREG_ST0) {
          /* gen_cvt_ftof(VT_DOUBLE); */
          o(0xf0245cdd); /* fstpl -0x10(%rsp) */
          /* movsd -0x10(%rsp),%xmmN */
          o(0x100ff2);
          o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
          o(0xf024);
        } else {
          assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
          if ((ft & VT_BTYPE) == VT_FLOAT) {
            o(0x100ff3);
          } else {
            assert((ft & VT_BTYPE) == VT_DOUBLE);
            o(0x100ff2);
          }
          o(0xc0 + REG_VALUE(v) + REG_VALUE(r) * 8);
        }
      } else if (r == TREG_ST0) {
        assert((v >= TREG_XMM0) && (v <= TREG_XMM7));
        /* gen_cvt_ftof(VT_LDOUBLE); */
        /* movsd %xmmN,-0x10(%rsp) */
        o(0x110ff2);
        o(0x44 + REG_VALUE(r) * 8); /* %xmmN */
        o(0xf024);
        o(0xf02444dd); /* fldl -0x10(%rsp) */
      } else {
        orex(1, r, v, 0x89);
        o(0xc0 + REG_VALUE(r) + REG_VALUE(v) * 8); /* mov v, r */
      }
    }
  }
}